

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module.cpp
# Opt level: O2

void __thiscall sc_core::sc_module::elaboration_done(sc_module *this,bool *error_)

{
  ostream *poVar1;
  char *local_1b8;
  hierarchy_scope scope;
  ostream local_188 [376];
  
  if (this->m_end_module_called == false) {
    std::__cxx11::stringstream::stringstream((stringstream *)&scope);
    poVar1 = std::operator<<(local_188,"module \'");
    poVar1 = std::operator<<(poVar1,(this->super_sc_object).m_name._M_dataplus._M_p);
    std::operator<<(poVar1,"\'");
    std::__cxx11::stringbuf::str();
    sc_report_handler::report
              (SC_WARNING,
               "module construction not properly completed: did you forget to add a sc_module_name parameter to your module constructor?"
               ,local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_module.cpp"
               ,0x199);
    std::__cxx11::string::_M_dispose();
    if (*error_ == true) {
      sc_report_handler::report
                (SC_WARNING,"hierarchical name as shown may be incorrect due to previous errors",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_module.cpp"
                 ,0x19b);
    }
    *error_ = true;
    std::__cxx11::stringstream::~stringstream((stringstream *)&scope);
  }
  sc_object::hierarchy_scope::hierarchy_scope(&scope,this);
  (*(this->super_sc_object)._vptr_sc_object[0x10])(this);
  sc_object::hierarchy_scope::~hierarchy_scope(&scope);
  return;
}

Assistant:

void
sc_module::elaboration_done( bool& error_ )
{
    if( ! m_end_module_called ) {
        std::stringstream msg;
        msg << "module '" << name() << "'";
        SC_REPORT_WARNING( SC_ID_END_MODULE_NOT_CALLED_, msg.str().c_str() );
        if( error_ ) {
            SC_REPORT_WARNING( SC_ID_HIER_NAME_INCORRECT_, 0 );
        }
        error_ = true;
    }
    hierarchy_scope scope(this);
    end_of_elaboration();
}